

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int add_hd_table_incremental
              (nghttp2_hd_context *context,nghttp2_hd_nv *nv,nghttp2_hd_map *map,uint32_t hash)

{
  size_t *psVar1;
  uint32_t uVar2;
  nghttp2_mem *mem;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  nghttp2_hd_entry *pnVar6;
  ulong uVar7;
  nghttp2_hd_entry **ppnVar8;
  nghttp2_hd_entry *pnVar9;
  nghttp2_hd_entry *pnVar10;
  ulong uVar11;
  int iVar12;
  size_t sVar13;
  ulong uVar14;
  
  mem = context->mem;
  uVar7 = context->hd_table_bufsize_max;
  uVar14 = nv->name->len + nv->value->len + 0x20;
  sVar13 = context->hd_table_bufsize;
  do {
    if ((sVar13 + uVar14 <= uVar7) || (sVar13 = (context->hd_table).len, sVar13 == 0)) {
      iVar12 = 0;
      if (uVar14 <= uVar7) {
        pnVar6 = (nghttp2_hd_entry *)nghttp2_mem_malloc(mem,0x50);
        if (pnVar6 == (nghttp2_hd_entry *)0x0) {
          iVar12 = -0x385;
        }
        else {
          nghttp2_hd_entry_init(pnVar6,nv);
          uVar7 = (context->hd_table).len + 1;
          iVar12 = 0;
          bVar3 = true;
          if ((context->hd_table).mask + 1 < uVar7) {
            uVar4 = 1;
            do {
              uVar11 = uVar4;
              uVar4 = uVar11 * 2;
            } while (uVar11 < uVar7);
            ppnVar8 = (nghttp2_hd_entry **)nghttp2_mem_malloc(mem,uVar11 * 8);
            if (ppnVar8 == (nghttp2_hd_entry **)0x0) {
              iVar12 = -0x385;
              bVar3 = false;
            }
            else {
              if ((context->hd_table).len != 0) {
                sVar13 = 0;
                do {
                  pnVar9 = hd_ringbuf_get(&context->hd_table,sVar13);
                  ppnVar8[sVar13] = pnVar9;
                  sVar13 = sVar13 + 1;
                } while (sVar13 < (context->hd_table).len);
              }
              nghttp2_mem_free(mem,(context->hd_table).buffer);
              (context->hd_table).buffer = ppnVar8;
              (context->hd_table).mask = uVar11 - 1;
              (context->hd_table).first = 0;
              iVar12 = 0;
              bVar3 = true;
            }
          }
          if (bVar3) {
            uVar7 = (context->hd_table).first - 1;
            (context->hd_table).first = uVar7;
            (context->hd_table).buffer[uVar7 & (context->hd_table).mask] = pnVar6;
            psVar1 = &(context->hd_table).len;
            *psVar1 = *psVar1 + 1;
            iVar12 = 0;
          }
          if (iVar12 == 0) {
            uVar2 = context->next_seq;
            context->next_seq = uVar2 + 1;
            pnVar6->seq = uVar2;
            pnVar6->hash = hash;
            if (map != (nghttp2_hd_map *)0x0) {
              if (map->table[hash & 0x7f] != (nghttp2_hd_entry *)0x0) {
                pnVar6->next = map->table[hash & 0x7f];
              }
              map->table[hash & 0x7f] = pnVar6;
            }
            context->hd_table_bufsize = context->hd_table_bufsize + uVar14;
            iVar12 = 0;
          }
          else {
            nghttp2_rcbuf_decref((pnVar6->nv).value);
            nghttp2_rcbuf_decref((pnVar6->nv).name);
            nghttp2_mem_free(mem,pnVar6);
          }
        }
      }
      return iVar12;
    }
    pnVar6 = hd_ringbuf_get(&context->hd_table,sVar13 - 1);
    sVar13 = (context->hd_table).len;
    context->hd_table_bufsize =
         (context->hd_table_bufsize - (((pnVar6->nv).name)->len + ((pnVar6->nv).value)->len)) - 0x20
    ;
    if (sVar13 == 0) {
      __assert_fail("ringbuf->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_hd.c"
                    ,0x29e,"void hd_ringbuf_pop_back(nghttp2_hd_ringbuf *)");
    }
    (context->hd_table).len = sVar13 - 1;
    if (map != (nghttp2_hd_map *)0x0) {
      uVar5 = pnVar6->hash & 0x7f;
      pnVar9 = map->table[uVar5];
      if (pnVar9 != (nghttp2_hd_entry *)0x0) {
        if (pnVar9 == pnVar6) {
          ppnVar8 = map->table + uVar5;
        }
        else {
          do {
            pnVar10 = pnVar9;
            pnVar9 = pnVar10->next;
            if (pnVar9 == (nghttp2_hd_entry *)0x0) goto LAB_0055e836;
          } while (pnVar9 != pnVar6);
          ppnVar8 = &pnVar10->next;
        }
        *ppnVar8 = pnVar6->next;
        pnVar6->next = (nghttp2_hd_entry *)0x0;
      }
    }
LAB_0055e836:
    nghttp2_rcbuf_decref((pnVar6->nv).value);
    nghttp2_rcbuf_decref((pnVar6->nv).name);
    nghttp2_mem_free(mem,pnVar6);
    sVar13 = context->hd_table_bufsize;
    uVar7 = context->hd_table_bufsize_max;
  } while( true );
}

Assistant:

static int add_hd_table_incremental(nghttp2_hd_context *context,
                                    nghttp2_hd_nv *nv, nghttp2_hd_map *map,
                                    uint32_t hash) {
  int rv;
  nghttp2_hd_entry *new_ent;
  size_t room;
  nghttp2_mem *mem;

  mem = context->mem;
  room = entry_room(nv->name->len, nv->value->len);

  while (context->hd_table_bufsize + room > context->hd_table_bufsize_max &&
         context->hd_table.len > 0) {

    size_t idx = context->hd_table.len - 1;
    nghttp2_hd_entry *ent = hd_ringbuf_get(&context->hd_table, idx);

    context->hd_table_bufsize -=
        entry_room(ent->nv.name->len, ent->nv.value->len);

    DEBUGF("hpack: remove item from header table: %s: %s\n",
           (char *)ent->nv.name->base, (char *)ent->nv.value->base);

    hd_ringbuf_pop_back(&context->hd_table);
    if (map) {
      hd_map_remove(map, ent);
    }

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }

  if (room > context->hd_table_bufsize_max) {
    /* The entry taking more than NGHTTP2_HD_MAX_BUFFER_SIZE is
       immediately evicted.  So we don't allocate memory for it. */
    return 0;
  }

  new_ent = nghttp2_mem_malloc(mem, sizeof(nghttp2_hd_entry));
  if (new_ent == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_hd_entry_init(new_ent, nv);

  rv = hd_ringbuf_push_front(&context->hd_table, new_ent, mem);

  if (rv != 0) {
    nghttp2_hd_entry_free(new_ent);
    nghttp2_mem_free(mem, new_ent);

    return rv;
  }

  new_ent->seq = context->next_seq++;
  new_ent->hash = hash;

  if (map) {
    hd_map_insert(map, new_ent);
  }

  context->hd_table_bufsize += room;

  return 0;
}